

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * cmTarget::GetFileSetsPropertyName(string *__return_storage_ptr__,string *type)

{
  bool bVar1;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *type_local;
  
  local_18 = type;
  type_local = __return_storage_ptr__;
  bVar1 = std::operator==(type,"HEADERS");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"HEADER_SETS",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else {
    bVar1 = std::operator==(local_18,"CXX_MODULES");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"CXX_MODULE_SETS",local_2d);
      std::allocator<char>::~allocator(local_2d);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_2e);
      std::allocator<char>::~allocator(&local_2e);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetFileSetsPropertyName(const std::string& type)
{
  if (type == "HEADERS") {
    return "HEADER_SETS";
  }
  if (type == "CXX_MODULES") {
    return "CXX_MODULE_SETS";
  }
  return "";
}